

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall Client::handleRegisterRequest(Client *this,RegisterRequest *request)

{
  CommunicationStack *pCVar1;
  bool bVar2;
  Event EVar3;
  bool local_189;
  RegisterResponse local_169;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_168;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [39];
  RegisterResponse local_d1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_d0;
  byte local_b9;
  string local_b8 [39];
  byte local_91;
  string local_90 [39];
  byte local_69;
  string local_68 [48];
  string local_38 [32];
  RegisterRequest *local_18;
  RegisterRequest *request_local;
  Client *this_local;
  
  local_18 = request;
  request_local = (RegisterRequest *)this;
  std::__cxx11::string::string(local_38,(string *)request);
  local_69 = 0;
  local_91 = 0;
  local_b9 = 0;
  bVar2 = Database::containsForbiddenChars((string *)local_38);
  local_189 = true;
  if (!bVar2) {
    std::__cxx11::string::string(local_68,(string *)&request->password);
    local_69 = 1;
    bVar2 = Database::containsForbiddenChars((string *)local_68);
    local_189 = true;
    if (!bVar2) {
      std::__cxx11::string::string(local_90,(string *)&request->alias);
      local_91 = 1;
      bVar2 = Database::containsForbiddenChars((string *)local_90);
      local_189 = true;
      if (!bVar2) {
        std::__cxx11::string::string(local_b8,(string *)&request->bio);
        local_b9 = 1;
        local_189 = Database::containsForbiddenChars((string *)local_b8);
      }
    }
  }
  if ((local_b9 & 1) != 0) {
    std::__cxx11::string::~string(local_b8);
  }
  if ((local_91 & 1) != 0) {
    std::__cxx11::string::~string(local_90);
  }
  if ((local_69 & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_38);
  if (local_189 == false) {
    std::__cxx11::string::string(local_f8,(string *)request);
    std::__cxx11::string::string(local_118,(string *)&request->alias);
    std::__cxx11::string::string(local_138,(string *)&request->bio);
    std::__cxx11::string::string(local_158,(string *)&request->password);
    Database::addUser(&server.database,(string *)local_f8,(string *)local_118,(string *)local_138,
                      (string *)local_158);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_f8);
    pCVar1 = this->communicationStack;
    RegisterResponse::RegisterResponse(&local_169,true);
    EVar3 = RegisterResponse::operator_cast_to_basic_json((RegisterResponse *)&local_168);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_168,EVar3.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_168);
  }
  else {
    pCVar1 = this->communicationStack;
    RegisterResponse::RegisterResponse(&local_d1,false);
    EVar3 = RegisterResponse::operator_cast_to_basic_json((RegisterResponse *)&local_d0);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_d0,EVar3.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_d0);
  }
  return;
}

Assistant:

void Client::handleRegisterRequest(RegisterRequest request)
{
	if(Database::containsForbiddenChars(request.username) ||
			Database::containsForbiddenChars(request.password) ||
			Database::containsForbiddenChars(request.alias) ||
			Database::containsForbiddenChars(request.bio))
	{
		communicationStack->sendEvent(RegisterResponse(false));
	}
	else
	{
		server.database.addUser(request.username, request.alias, request.bio, request.password);
		communicationStack->sendEvent(RegisterResponse(true));
	}
}